

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.cc
# Opt level: O2

TypeInfo * google::protobuf::util::converter::TypeInfo::NewTypeInfo(TypeResolver *type_resolver)

{
  TypeInfo *pTVar1;
  
  pTVar1 = (TypeInfo *)operator_new(0xd0);
  pTVar1->_vptr_TypeInfo = (_func_int **)&PTR__TypeInfoForTypeResolver_003e4168;
  pTVar1[1]._vptr_TypeInfo = (_func_int **)type_resolver;
  *(undefined4 *)&pTVar1[3]._vptr_TypeInfo = 0;
  pTVar1[4]._vptr_TypeInfo = (_func_int **)0x0;
  pTVar1[5]._vptr_TypeInfo = (_func_int **)(pTVar1 + 3);
  pTVar1[6]._vptr_TypeInfo = (_func_int **)(pTVar1 + 3);
  pTVar1[7]._vptr_TypeInfo = (_func_int **)0x0;
  *(undefined4 *)&pTVar1[9]._vptr_TypeInfo = 0;
  pTVar1[10]._vptr_TypeInfo = (_func_int **)0x0;
  pTVar1[0xb]._vptr_TypeInfo = (_func_int **)(pTVar1 + 9);
  pTVar1[0xc]._vptr_TypeInfo = (_func_int **)(pTVar1 + 9);
  pTVar1[0xd]._vptr_TypeInfo = (_func_int **)0x0;
  *(undefined4 *)&pTVar1[0xf]._vptr_TypeInfo = 0;
  pTVar1[0x10]._vptr_TypeInfo = (_func_int **)0x0;
  pTVar1[0x11]._vptr_TypeInfo = (_func_int **)(pTVar1 + 0xf);
  pTVar1[0x12]._vptr_TypeInfo = (_func_int **)(pTVar1 + 0xf);
  pTVar1[0x13]._vptr_TypeInfo = (_func_int **)0x0;
  *(undefined4 *)&pTVar1[0x15]._vptr_TypeInfo = 0;
  pTVar1[0x16]._vptr_TypeInfo = (_func_int **)0x0;
  pTVar1[0x17]._vptr_TypeInfo = (_func_int **)(pTVar1 + 0x15);
  pTVar1[0x18]._vptr_TypeInfo = (_func_int **)(pTVar1 + 0x15);
  pTVar1[0x19]._vptr_TypeInfo = (_func_int **)0x0;
  return pTVar1;
}

Assistant:

TypeInfo* TypeInfo::NewTypeInfo(TypeResolver* type_resolver) {
  return new TypeInfoForTypeResolver(type_resolver);
}